

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckEndOfFileNewLine.cxx
# Opt level: O3

bool __thiscall kws::Parser::CheckEndOfFileNewLine(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char cVar3;
  char *__s;
  pointer pcVar4;
  long lVar5;
  char *pcVar6;
  size_type sVar7;
  size_t pos;
  ulong uVar8;
  Error error;
  value_type local_68;
  
  this->m_TestsDone[9] = true;
  __s = (char *)operator_new__(0xff);
  builtin_strncpy(__s,"The file should have only one new line",0x27);
  pcVar6 = (char *)this->m_TestsDescription[9]._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 9),0,pcVar6,(ulong)__s);
  operator_delete__(__s);
  pcVar4 = (this->m_Buffer)._M_dataplus._M_p;
  sVar7 = (this->m_Buffer)._M_string_length;
  pos = sVar7 - 1;
  cVar2 = pcVar4[sVar7 - 1];
  if (cVar2 != '\n') {
    paVar1 = &local_68.description.field_2;
    local_68.description._M_string_length = 0;
    local_68.description.field_2._M_local_buf[0] = '\0';
    local_68.description._M_dataplus._M_p = (pointer)paVar1;
    local_68.line = GetLineNumber(this,pos,false);
    local_68.number = 9;
    local_68.line2 = local_68.line;
    std::__cxx11::string::_M_replace
              ((ulong)&local_68.description,0,(char *)local_68.description._M_string_length,0x176599
              );
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.description._M_dataplus._M_p);
    }
    pcVar4 = (this->m_Buffer)._M_dataplus._M_p;
    sVar7 = (this->m_Buffer)._M_string_length;
    pos = sVar7 - 1;
    if ((pcVar4[sVar7 - 1] != ' ') && (pcVar4[sVar7 - 1] != '\n')) goto LAB_00150a8a;
  }
  uVar8 = 0;
  do {
    cVar3 = pcVar4[sVar7 - 1];
    if ((cVar3 == '\n') || (cVar3 == ' ')) {
      if ((long)sVar7 < 2) break;
    }
    else if (((long)sVar7 < 2) || (cVar3 != '\r')) break;
    uVar8 = uVar8 + (cVar3 == '\n');
    sVar7 = sVar7 - 1;
  } while( true );
  if (1 < uVar8) {
    paVar1 = &local_68.description.field_2;
    local_68.description._M_string_length = 0;
    local_68.description.field_2._M_local_buf[0] = '\0';
    local_68.description._M_dataplus._M_p = (pointer)paVar1;
    lVar5 = GetLineNumber(this,pos,false);
    local_68.line2 = lVar5 + 1;
    local_68.line = (lVar5 - uVar8) + 3;
    local_68.number = 9;
    std::__cxx11::string::_M_replace
              ((ulong)&local_68.description,0,(char *)local_68.description._M_string_length,0x1765b8
              );
    pcVar6 = (char *)operator_new__(10);
    snprintf(pcVar6,10,"%ld",uVar8);
    std::__cxx11::string::append((char *)&local_68.description);
    operator_delete__(pcVar6);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.description._M_dataplus._M_p);
    }
  }
LAB_00150a8a:
  return cVar2 == '\n';
}

Assistant:

bool Parser::CheckEndOfFileNewLine()
{
  m_TestsDone[EOF_NEW_LINE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"The file should have only one new line");
  m_TestsDescription[EOF_NEW_LINE] = val;
  delete [] val;
  bool hasError = false;

  // Check if the last character is an end of line
  if(m_Buffer[m_Buffer.size()-1] != '\n')
    {
    Error error;
    error.line = this->GetLineNumber(m_Buffer.size()-1,false);
    error.line2 = error.line;
    error.number = EOF_NEW_LINE;
    error.description = "No new line at the end of file";
    m_ErrorList.push_back(error);
    hasError = true;
    }

  // Check the number empty lines at the end of the file
  if((m_Buffer[m_Buffer.size()-1] == ' ') || (m_Buffer[m_Buffer.size()-1] == '\n'))
    {
    long i = static_cast<long>(m_Buffer.size())-1;
    unsigned long numberOfEmptyLines = 0;
    while( ((m_Buffer[i] == '\n') ||  (m_Buffer[i] == ' ') || (m_Buffer[i] == '\r')) && (i>0))
      {
      if(m_Buffer[i] == '\n')
        {
        numberOfEmptyLines++;
        }
      i-=1;
      }

    if(numberOfEmptyLines>1)
      {
      // Maybe should be info and not error
      Error info;
      info.line2 = this->GetLineNumber(m_Buffer.size()-1,false)+1;
      info.line = info.line2-numberOfEmptyLines+2;
      info.number = EOF_NEW_LINE;
      info.description = "Number of empty lines at the end of files: ";
      constexpr size_t length = 10;
      char* localval = new char[length];
      snprintf(localval,length,"%ld",numberOfEmptyLines);
      info.description += localval;
      delete [] localval;
      m_ErrorList.push_back(info);
      }
    }

  return !hasError;
}